

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

bool duckdb::AddPropagateStatistics::Operation<int,duckdb::TryDecimalAdd>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  bool bVar1;
  int left;
  int right;
  int64_t unaff_retaddr;
  LogicalType *in_stack_00000008;
  int max;
  int min;
  Value *in_stack_ffffffffffffff38;
  int32_t in_stack_ffffffffffffff40;
  BaseStatistics *in_stack_ffffffffffffff90;
  undefined1 local_1;
  
  left = NumericStats::GetMin<int>(in_stack_ffffffffffffff90);
  NumericStats::GetMin<int>(in_stack_ffffffffffffff90);
  bVar1 = TryDecimalAdd::Operation<int,int,int>
                    (left,in_stack_ffffffffffffff40,(int32_t *)in_stack_ffffffffffffff38);
  if (bVar1) {
    right = NumericStats::GetMax<int>(in_stack_ffffffffffffff90);
    NumericStats::GetMax<int>(in_stack_ffffffffffffff90);
    bVar1 = TryDecimalAdd::Operation<int,int,int>(left,right,(int32_t *)in_stack_ffffffffffffff38);
    if (bVar1) {
      Value::Numeric(in_stack_00000008,unaff_retaddr);
      Value::operator=((Value *)CONCAT44(left,right),in_stack_ffffffffffffff38);
      Value::~Value((Value *)CONCAT44(left,right));
      Value::Numeric(in_stack_00000008,unaff_retaddr);
      Value::operator=((Value *)CONCAT44(left,right),in_stack_ffffffffffffff38);
      Value::~Value((Value *)CONCAT44(left,right));
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		// new min is min+min
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMin<T>(rstats), min)) {
			return true;
		}
		// new max is max+max
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMax<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}